

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O1

FT_Error pfr_slot_load(FT_GlyphSlot pfrslot,FT_Size pfrsize,FT_UInt gindex,FT_Int32 load_flags)

{
  FT_Outline *outline;
  short sVar1;
  uint uVar2;
  FT_Generic_Finalizer p_Var3;
  FT_Pos FVar4;
  FT_Pos FVar5;
  bool bVar6;
  undefined8 uVar7;
  short *psVar8;
  FT_Face pFVar9;
  FT_UInt format_00;
  FT_Error FVar10;
  int iVar11;
  long lVar12;
  FT_Long FVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  FT_Pos *pFVar17;
  ulong uVar18;
  FT_Error FVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  FT_Stream pFVar26;
  FT_Vector *pFVar27;
  byte *pbVar28;
  byte *pbVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint *puVar33;
  bool bVar34;
  bool bVar35;
  FT_UInt ysize;
  FT_UInt xsize;
  FT_GlyphSlot local_b0;
  FT_Stream local_a8;
  uint *local_a0;
  ulong local_98;
  FT_Face local_90;
  FT_Size local_88;
  ulong local_80;
  FT_Long advance;
  uint local_70;
  FT_UInt format;
  FT_Long ypos;
  uint local_5c;
  uchar *local_58;
  FT_Long xpos;
  long local_48;
  long local_40;
  long local_38;
  
  local_90 = pfrslot->face;
  uVar32 = gindex - 1;
  if (gindex == 0) {
    uVar32 = 0;
  }
  if (local_90 == (FT_Face)0x0) {
    return 6;
  }
  if (*(uint *)&local_90[2].generic.data <= uVar32) {
    return 6;
  }
  local_70 = load_flags;
  if (((load_flags & 9U) == 0) && (iVar11 = *(int *)&local_90[2].style_name, iVar11 != 0)) {
    local_a0 = (uint *)((ulong)uVar32 * 0x10 + local_90[2].bbox.xMin);
    puVar33 = *(uint **)&local_90[2].num_fixed_sizes;
    do {
      if ((*puVar33 == (uint)(pfrsize->metrics).x_ppem) &&
         (puVar33[1] == (uint)(pfrsize->metrics).y_ppem)) {
        uVar2 = puVar33[2];
        local_b0 = pfrslot;
        local_a8 = local_90->stream;
        local_88 = pfrsize;
        FVar10 = FT_Stream_Seek(local_90->stream,
                                (ulong)puVar33[6] + *(long *)&local_90[2].units_per_EM);
        FVar19 = 6;
        pfrslot = local_b0;
        if (FVar10 != 0) goto LAB_0022e38f;
        iVar11 = (uVar2 & 1) + 5;
        if ((uVar2 & 2) == 0) {
          iVar11 = (uVar2 & 1) + 4;
        }
        FVar10 = FT_Stream_EnterFrame
                           (local_a8,(ulong)((iVar11 + (uint)((uVar2 >> 2 & 1) != 0)) * puVar33[7]))
        ;
        pfrslot = local_b0;
        if (FVar10 != 0) goto LAB_0022e38f;
        pbVar29 = local_a8->cursor;
        uVar2 = puVar33[2];
        uVar20 = puVar33[7];
        local_5c = *local_a0;
        uVar24 = uVar2 & 1;
        iVar11 = uVar24 + 5;
        if ((uVar2 & 2) == 0) {
          iVar11 = uVar24 + 4;
        }
        uVar14 = iVar11 + (uint)((uVar2 >> 2 & 1) != 0);
        if ((uVar2 & 0x40) != 0) goto LAB_0022e593;
        pbVar28 = local_a8->limit;
        puVar33[2] = uVar2 | 0x80;
        if (pbVar28 < pbVar29 + uVar14 * uVar20) goto LAB_0022e4e2;
        if (uVar14 * uVar20 == 0) goto LAB_0022e58e;
        uVar15 = 0xffffffffffffffff;
        pbVar28 = pbVar29;
        goto LAB_0022e560;
      }
      puVar33 = puVar33 + 10;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  goto LAB_0022e07a;
LAB_0022e4e2:
  puVar33[2] = uVar2 & 0xffffff3f;
  goto LAB_0022e58e;
  while (pbVar28 = pbVar28 + uVar14, uVar15 = uVar18, pbVar28 < pbVar29 + uVar14 * uVar20) {
LAB_0022e560:
    uVar18 = (ulong)*pbVar28;
    if (uVar24 != 0) {
      uVar18 = (ulong)CONCAT11(*pbVar28,pbVar28[1]);
    }
    if ((long)uVar18 <= (long)uVar15) goto LAB_0022e4e2;
  }
LAB_0022e58e:
  *(byte *)(puVar33 + 2) = (byte)puVar33[2] | 0x40;
LAB_0022e593:
  uVar2 = puVar33[2];
  local_98 = 0;
  if ((char)uVar2 < '\0') {
    uVar31 = uVar20 >> 1;
    uVar30 = 0;
    do {
      if (uVar20 <= uVar30) goto LAB_0022e5a5;
      uVar15 = (ulong)(uVar31 * uVar14);
      uVar22 = (uint)pbVar29[uVar15];
      if (uVar24 == 0) {
        lVar12 = uVar15 + 1;
      }
      else {
        lVar12 = uVar15 + 2;
        uVar22 = (uint)CONCAT11(pbVar29[uVar15],pbVar29[uVar15 + 1]);
      }
      pbVar28 = pbVar29 + lVar12;
      uVar16 = uVar31;
      if (uVar22 <= local_5c) {
        if (uVar22 <= local_5c && local_5c - uVar22 != 0) {
          uVar30 = uVar31 + 1;
          uVar16 = uVar20;
          goto LAB_0022e5fd;
        }
        bVar6 = false;
      }
      else {
LAB_0022e5fd:
        uVar20 = (local_5c - uVar22) + uVar31;
        uVar22 = (uVar16 - uVar30 >> 1) + uVar30;
        uVar31 = uVar20;
        if (uVar20 < uVar30) {
          uVar31 = uVar22;
        }
        if (uVar16 <= uVar20) {
          uVar31 = uVar22;
        }
        bVar6 = true;
        uVar20 = uVar16;
      }
    } while (bVar6);
    local_98 = (ulong)*pbVar28;
    if ((uVar2 & 2) == 0) {
      pbVar29 = pbVar28 + 1;
    }
    else {
      pbVar29 = pbVar28 + 2;
      local_98 = (ulong)CONCAT11(*pbVar28,pbVar28[1]);
    }
    uVar15 = (ulong)pbVar29[1];
    if ((uVar2 & 4) == 0) {
      local_80 = (ulong)*pbVar29 << 8;
    }
    else {
      uVar15 = (ulong)((uint)pbVar29[1] << 8 | (uint)*pbVar29 << 0x10);
      local_80 = (ulong)pbVar29[2];
    }
    local_80 = local_80 | uVar15;
  }
  else {
LAB_0022e5a5:
    local_80 = 0;
  }
  FT_Stream_ExitFrame(local_a8);
  FVar19 = 6;
  FVar10 = FVar19;
  if (local_98 != 0) {
    FVar19 = 0;
    FVar10 = FVar19;
  }
LAB_0022e38f:
  if (FVar19 != 6) {
    pfrsize = local_88;
    if (FVar19 != 0) goto LAB_0022e07a;
    xpos = 0;
    ypos = 0;
    xsize = 0;
    ysize = 0;
    format = 0;
    advance = (FT_Long)(int)local_a0[1];
    uVar2 = *(uint *)((long)&local_90[1].driver + 4);
    if (uVar2 != *(uint *)&local_90[1].driver) {
      advance = FT_MulDiv(advance,(ulong)*(uint *)&local_90[1].driver,(ulong)uVar2);
    }
    pFVar9 = local_90;
    pfrslot->linearHoriAdvance = advance;
    FVar13 = FT_MulDiv((ulong)(local_88->metrics).x_ppem << 8,(long)(int)local_a0[1],
                       (ulong)*(uint *)((long)&local_90[1].driver + 4));
    pFVar26 = local_a8;
    advance = FVar13;
    FVar10 = FT_Stream_Seek(local_a8,local_80 + (uint)pFVar9[1].num_fixed_sizes);
    iVar11 = 6;
    if (FVar10 == 0) {
      local_a0 = (uint *)FVar13;
      FVar10 = FT_Stream_EnterFrame(pFVar26,local_98);
      if (FVar10 == 0) {
        local_58 = pFVar26->cursor;
        FVar10 = pfr_load_bitmap_metrics
                           (&local_58,pFVar26->limit,(FT_Long)local_a0,&xpos,&ypos,&xsize,&ysize,
                            &advance,&format);
        format_00 = format;
        pFVar26 = local_a8;
        if (FVar10 == 0) {
          if (format == 2) {
            uVar15 = (ulong)ysize * (ulong)xsize;
            uVar18 = local_98 + 1 >> 1;
            bVar34 = uVar15 < uVar18 * 0xff;
            bVar35 = uVar15 + uVar18 * -0xff == 0;
            bVar6 = bVar34 || bVar35;
            FVar10 = (uint)(!bVar34 && !bVar35) << 3;
          }
          else {
            if (format == 1) {
              bVar34 = (ulong)ysize * (ulong)xsize < local_98 * 0xf;
              bVar35 = (ulong)ysize * (ulong)xsize + local_98 * -0xf == 0;
            }
            else {
              if (format != 0) {
                FVar10 = 8;
                bVar6 = false;
                goto LAB_0022e740;
              }
              uVar15 = (ulong)ysize * (ulong)xsize + 7 >> 3;
              bVar34 = uVar15 < local_98;
              bVar35 = uVar15 == local_98;
            }
            bVar6 = bVar34 || bVar35;
            FVar10 = (uint)(!bVar34 && !bVar35) << 3;
          }
LAB_0022e740:
          if (bVar6) {
            uVar15 = (ulong)ysize;
            if (((int)ysize < 0 || (int)xpos != xpos) ||
               ((long)(ypos + uVar15) < -0x80000000 || (long)(uVar15 ^ 0x7fffffff) < ypos)) {
              FVar10 = 0x17;
              bVar6 = false;
            }
            else {
              FVar10 = 0;
              bVar6 = true;
            }
            if (bVar6) {
              pfrslot->format = FT_GLYPH_FORMAT_BITMAP;
              (pfrslot->bitmap).width = xsize;
              (pfrslot->bitmap).rows = ysize;
              iVar11 = (int)(xsize + 7) >> 3;
              (pfrslot->bitmap).pitch = iVar11;
              (pfrslot->bitmap).pixel_mode = '\x01';
              (pfrslot->metrics).width = (ulong)xsize * 0x40;
              (pfrslot->metrics).height = uVar15 << 6;
              (pfrslot->metrics).horiBearingX = xpos << 6;
              (pfrslot->metrics).horiBearingY = ypos << 6;
              (pfrslot->metrics).horiAdvance = (advance >> 2) + 0x20U & 0xffffffffffffffc0;
              (pfrslot->metrics).vertBearingX = (long)((ulong)xsize * -0x40) >> 1;
              (pfrslot->metrics).vertBearingY = 0;
              (pfrslot->metrics).vertAdvance = (local_88->metrics).height;
              pfrslot->bitmap_left = (int)xpos;
              pfrslot->bitmap_top = (int)ypos + ysize;
              if ((local_70 >> 0x16 & 1) == 0) {
                FVar10 = ft_glyphslot_alloc_bitmap(pfrslot,(long)iVar11 * uVar15);
                pFVar26 = local_a8;
                pfrslot = local_b0;
                if (FVar10 != 0) goto LAB_0022e8af;
                pfr_load_bitmap_bits
                          (local_58,local_a8->limit,format_00,(byte)local_90[1].field_0x4c >> 1 & 1,
                           &local_b0->bitmap);
              }
              FVar10 = 0;
            }
          }
        }
LAB_0022e8af:
        FT_Stream_ExitFrame(pFVar26);
        iVar11 = 0;
      }
      else {
        iVar11 = 6;
      }
    }
    if ((iVar11 != 6) && (pfrsize = local_88, iVar11 != 0)) goto LAB_0022e07a;
  }
  pfrsize = local_88;
  if (FVar10 == 0) {
    return 0;
  }
LAB_0022e07a:
  if (((uint)load_flags >> 0xe & 1) != 0) {
    return 6;
  }
  lVar12 = local_90[2].bbox.xMin;
  lVar21 = (ulong)uVar32 * 0x10;
  pfrslot->format = FT_GLYPH_FORMAT_OUTLINE;
  (pfrslot->outline).n_contours = 0;
  (pfrslot->outline).n_points = 0;
  local_b0 = (FT_GlyphSlot)(ulong)(uint)local_90[1].num_fixed_sizes;
  pFVar26 = local_90->stream;
  local_a0 = (uint *)(ulong)*(uint *)(lVar12 + 8 + lVar21);
  uVar32 = *(uint *)(lVar12 + 0xc + lVar21);
  local_88 = pfrsize;
  FT_GlyphLoader_Rewind((FT_GlyphLoader)pfrslot[1].generic.finalizer);
  pfrslot[1].glyph_index = 0;
  FVar10 = pfr_glyph_load_rec((PFR_Glyph)(pfrslot + 1),pFVar26,(FT_ULong)local_b0,(ulong)uVar32,
                              (FT_ULong)local_a0);
  if (FVar10 == 0) {
    outline = &pfrslot->outline;
    p_Var3 = pfrslot[1].generic.finalizer;
    *(undefined8 *)&(pfrslot->outline).flags = *(undefined8 *)(p_Var3 + 0x38);
    uVar7 = *(undefined8 *)(p_Var3 + 0x18);
    pFVar27 = *(FT_Vector **)(p_Var3 + 0x20);
    psVar8 = *(short **)(p_Var3 + 0x30);
    (pfrslot->outline).tags = *(char **)(p_Var3 + 0x28);
    (pfrslot->outline).contours = psVar8;
    outline->n_contours = (short)uVar7;
    outline->n_points = (short)((ulong)uVar7 >> 0x10);
    *(int *)&outline->field_0x4 = (int)((ulong)uVar7 >> 0x20);
    (pfrslot->outline).points = pFVar27;
    uVar32 = (pfrslot->outline).flags & 0xfffffffa;
    (pfrslot->outline).flags = uVar32 + 4;
    if ((local_88->metrics).y_ppem < 0x18) {
      (pfrslot->outline).flags = uVar32 | 0x104;
    }
    (pfrslot->metrics).horiAdvance = 0;
    (pfrslot->metrics).vertAdvance = 0;
    lVar12 = (long)*(int *)(lVar12 + lVar21 + 4);
    uVar32 = *(uint *)((long)&local_90[1].driver + 4);
    if (uVar32 != *(uint *)&local_90[1].driver) {
      lVar12 = FT_MulDiv(lVar12,(ulong)*(uint *)&local_90[1].driver,(ulong)uVar32);
    }
    pFVar17 = &(pfrslot->metrics).vertAdvance;
    if (((ulong)local_90[1].autohint.data & 1) == 0) {
      pFVar17 = &(pfrslot->metrics).horiAdvance;
    }
    *pFVar17 = lVar12;
    FVar4 = (pfrslot->metrics).horiAdvance;
    FVar5 = (pfrslot->metrics).vertAdvance;
    pfrslot->linearHoriAdvance = FVar4;
    pfrslot->linearVertAdvance = FVar5;
    (pfrslot->metrics).vertBearingX = 0;
    (pfrslot->metrics).vertBearingY = 0;
    if ((local_70 & 1) == 0) {
      sVar1 = (pfrslot->outline).n_points;
      iVar25 = (int)sVar1;
      iVar23 = (int)(local_88->metrics).x_scale;
      iVar11 = (int)(local_88->metrics).y_scale;
      if (0 < sVar1) {
        pFVar27 = (pfrslot->outline).points;
        do {
          lVar12 = (long)(int)pFVar27->x * (long)iVar23;
          pFVar27->x = (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
          lVar12 = (long)(int)pFVar27->y * (long)iVar11;
          pFVar27->y = (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
          pFVar27 = pFVar27 + 1;
          iVar25 = iVar25 + -1;
        } while (iVar25 != 0);
      }
      lVar12 = (long)iVar23 * (long)(int)FVar4;
      (pfrslot->metrics).horiAdvance =
           (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
      lVar12 = (long)iVar11 * (long)(int)FVar5;
      (pfrslot->metrics).vertAdvance =
           (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
    }
    FT_Outline_Get_CBox(outline,(FT_BBox *)&xpos);
    (pfrslot->metrics).width = local_40 - xpos;
    (pfrslot->metrics).height = local_38 - local_48;
    (pfrslot->metrics).horiBearingX = xpos;
    (pfrslot->metrics).horiBearingY = local_48;
    return 0;
  }
  return FVar10;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_slot_load( FT_GlyphSlot  pfrslot,         /* PFR_Slot */
                 FT_Size       pfrsize,         /* PFR_Size */
                 FT_UInt       gindex,
                 FT_Int32      load_flags )
  {
    PFR_Slot     slot    = (PFR_Slot)pfrslot;
    PFR_Size     size    = (PFR_Size)pfrsize;
    FT_Error     error;
    PFR_Face     face    = (PFR_Face)pfrslot->face;
    PFR_Char     gchar;
    FT_Outline*  outline = &pfrslot->outline;
    FT_ULong     gps_offset;


    FT_TRACE1(( "pfr_slot_load: glyph index %d\n", gindex ));

    if ( gindex > 0 )
      gindex--;

    if ( !face || gindex >= face->phy_font.num_chars )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* try to load an embedded bitmap */
    if ( !( load_flags & ( FT_LOAD_NO_SCALE | FT_LOAD_NO_BITMAP ) ) )
    {
      error = pfr_slot_load_bitmap(
                slot,
                size,
                gindex,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      if ( !error )
        goto Exit;
    }

    if ( load_flags & FT_LOAD_SBITS_ONLY )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    gchar               = face->phy_font.chars + gindex;
    pfrslot->format     = FT_GLYPH_FORMAT_OUTLINE;
    outline->n_points   = 0;
    outline->n_contours = 0;
    gps_offset          = face->header.gps_section_offset;

    /* load the glyph outline (FT_LOAD_NO_RECURSE isn't supported) */
    error = pfr_glyph_load( &slot->glyph, face->root.stream,
                            gps_offset, gchar->gps_offset, gchar->gps_size );

    if ( !error )
    {
      FT_BBox            cbox;
      FT_Glyph_Metrics*  metrics = &pfrslot->metrics;
      FT_Pos             advance;
      FT_UInt            em_metrics, em_outline;
      FT_Bool            scaling;


      scaling = FT_BOOL( !( load_flags & FT_LOAD_NO_SCALE ) );

      /* copy outline data */
      *outline = slot->glyph.loader->base.outline;

      outline->flags &= ~FT_OUTLINE_OWNER;
      outline->flags |= FT_OUTLINE_REVERSE_FILL;

      if ( pfrsize->metrics.y_ppem < 24 )
        outline->flags |= FT_OUTLINE_HIGH_PRECISION;

      /* compute the advance vector */
      metrics->horiAdvance = 0;
      metrics->vertAdvance = 0;

      advance    = gchar->advance;
      em_metrics = face->phy_font.metrics_resolution;
      em_outline = face->phy_font.outline_resolution;

      if ( em_metrics != em_outline )
        advance = FT_MulDiv( advance,
                             (FT_Long)em_outline,
                             (FT_Long)em_metrics );

      if ( face->phy_font.flags & PFR_PHY_VERTICAL )
        metrics->vertAdvance = advance;
      else
        metrics->horiAdvance = advance;

      pfrslot->linearHoriAdvance = metrics->horiAdvance;
      pfrslot->linearVertAdvance = metrics->vertAdvance;

      /* make up vertical metrics(?) */
      metrics->vertBearingX = 0;
      metrics->vertBearingY = 0;

#if 0 /* some fonts seem to be broken here! */

      /* Apply the font matrix, if any.                 */
      /* TODO: Test existing fonts with unusual matrix  */
      /* whether we have to adjust Units per EM.        */
      {
        FT_Matrix font_matrix;


        font_matrix.xx = face->log_font.matrix[0] << 8;
        font_matrix.yx = face->log_font.matrix[1] << 8;
        font_matrix.xy = face->log_font.matrix[2] << 8;
        font_matrix.yy = face->log_font.matrix[3] << 8;

        FT_Outline_Transform( outline, &font_matrix );
      }
#endif

      /* scale when needed */
      if ( scaling )
      {
        FT_Int      n;
        FT_Fixed    x_scale = pfrsize->metrics.x_scale;
        FT_Fixed    y_scale = pfrsize->metrics.y_scale;
        FT_Vector*  vec     = outline->points;


        /* scale outline points */
        for ( n = 0; n < outline->n_points; n++, vec++ )
        {
          vec->x = FT_MulFix( vec->x, x_scale );
          vec->y = FT_MulFix( vec->y, y_scale );
        }

        /* scale the advance */
        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
      }

      /* compute the rest of the metrics */
      FT_Outline_Get_CBox( outline, &cbox );

      metrics->width        = cbox.xMax - cbox.xMin;
      metrics->height       = cbox.yMax - cbox.yMin;
      metrics->horiBearingX = cbox.xMin;
      metrics->horiBearingY = cbox.yMax - metrics->height;
    }

  Exit:
    return error;
  }